

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

int P_Find3DFloor(sector_t *sec,DVector3 *pos,bool above,bool floor,double *cmpz)

{
  bool bVar1;
  DVector3 *pDVar2;
  int iVar3;
  uint uVar4;
  secplane_t *psVar5;
  F3DFloor **ppFVar6;
  double dVar7;
  double dVar8;
  TVector2<double> local_b0;
  TVector2<double> local_a0;
  TVector2<double> local_90;
  TVector2<double> local_80;
  F3DFloor *local_70;
  F3DFloor *rover;
  undefined1 local_60 [4];
  int i;
  TVector2<double> local_50;
  TVector2<double> local_40;
  double *local_30;
  double *cmpz_local;
  bool floor_local;
  DVector3 *pDStack_20;
  bool above_local;
  DVector3 *pos_local;
  sector_t *sec_local;
  
  local_30 = cmpz;
  cmpz_local._6_1_ = floor;
  cmpz_local._7_1_ = above;
  pDStack_20 = pos;
  pos_local = (DVector3 *)sec;
  if (sec == (sector_t *)0x0) {
    TVector2<double>::TVector2(&local_40,pos);
    pos_local = (DVector3 *)P_PointInSector(&local_40);
  }
  psVar5 = (secplane_t *)(pos_local + 9);
  TVector2<double>::TVector2(&local_50,pDStack_20);
  dVar7 = secplane_t::ZatPoint(psVar5,&local_50);
  *local_30 = dVar7;
  if (pDStack_20->Z < *local_30) {
    pDVar2 = pos_local + 7;
    TVector2<double>::TVector2((TVector2<double> *)local_60,pDStack_20);
    dVar7 = secplane_t::ZatPoint((secplane_t *)&pDVar2->Y,(DVector2 *)local_60);
    *local_30 = dVar7;
    if (*local_30 < pDStack_20->Z) {
      for (rover._4_4_ = 0; iVar3 = rover._4_4_,
          uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)((long)pos_local[0x15].Y + 0x70)),
          iVar3 < (int)uVar4; rover._4_4_ = rover._4_4_ + 1) {
        ppFVar6 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)((long)pos_local[0x15].Y + 0x70),
                             (long)rover._4_4_);
        local_70 = *ppFVar6;
        if (((local_70->flags & 2) != 0) && ((local_70->flags & 1) != 0)) {
          if ((cmpz_local._7_1_ & 1) == 0) {
            bVar1 = false;
            if ((cmpz_local._6_1_ & 1) == 0) {
              dVar7 = pDStack_20->Z;
              psVar5 = (local_70->bottom).plane;
              TVector2<double>::TVector2(&local_a0,pDStack_20);
              dVar8 = secplane_t::ZatPoint(psVar5,&local_a0);
              *local_30 = dVar8;
              bVar1 = dVar7 <= dVar8;
            }
            if (bVar1) {
              return rover._4_4_;
            }
            dVar7 = pDStack_20->Z;
            psVar5 = (local_70->top).plane;
            TVector2<double>::TVector2(&local_b0,pDStack_20);
            dVar8 = secplane_t::ZatPoint(psVar5,&local_b0);
            *local_30 = dVar8;
            if (dVar7 <= dVar8) {
              return rover._4_4_;
            }
          }
          else {
            bVar1 = false;
            if ((cmpz_local._6_1_ & 1) != 0) {
              dVar7 = pDStack_20->Z;
              psVar5 = (local_70->top).plane;
              TVector2<double>::TVector2(&local_80,pDStack_20);
              dVar8 = secplane_t::ZatPoint(psVar5,&local_80);
              *local_30 = dVar8;
              bVar1 = dVar8 <= dVar7;
            }
            if (bVar1) {
              return rover._4_4_ + -1;
            }
            dVar7 = pDStack_20->Z;
            psVar5 = (local_70->bottom).plane;
            TVector2<double>::TVector2(&local_90,pDStack_20);
            dVar8 = secplane_t::ZatPoint(psVar5,&local_90);
            *local_30 = dVar8;
            if (dVar8 <= dVar7) {
              return rover._4_4_ + -1;
            }
          }
        }
      }
    }
  }
  return -1;
}

Assistant:

int	P_Find3DFloor(sector_t * sec, const DVector3 &pos, bool above, bool floor, double &cmpz)
{
	// If no sector given, find the one appropriate
	if (sec == NULL)
		sec = P_PointInSector(pos);

	// Above normal ceiling
	cmpz = sec->ceilingplane.ZatPoint(pos);
	if (pos.Z >= cmpz)
		return -1;

	// Below normal floor
	cmpz = sec->floorplane.ZatPoint(pos);
	if (pos.Z <= cmpz)
		return -1;

	// Looking through planes from top to bottom
	for (int i = 0; i < (signed)sec->e->XFloor.ffloors.Size(); ++i)
	{
		F3DFloor *rover = sec->e->XFloor.ffloors[i];

		// We are only interested in solid 3D floors here
		if(!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		if (above)
		{
			// z is above that floor
			if (floor && (pos.Z >= (cmpz = rover->top.plane->ZatPoint(pos))))
				return i - 1;
			// z is above that ceiling
			if (pos.Z >= (cmpz = rover->bottom.plane->ZatPoint(pos)))
				return i - 1;
		}
		else // below
		{
			// z is below that ceiling
			if (!floor && (pos.Z <= (cmpz = rover->bottom.plane->ZatPoint(pos))))
				return i;
			// z is below that floor
			if (pos.Z <= (cmpz = rover->top.plane->ZatPoint(pos)))
				return i;
		}
	}

	// Failsafe
	return -1;
}